

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_4::Compressor::runDecodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  exr_context_t p_Var4;
  ArgExc *pAVar5;
  unsigned_long *puVar6;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  uint64_t fullbuf;
  uint64_t expectedOutputSize;
  exr_chunk_info_t cinfo;
  exr_result_t rv;
  char *in_stack_ffffffffffffff28;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffff30;
  unsigned_long local_98 [3];
  ulong local_80;
  undefined1 local_78 [22];
  undefined1 local_62;
  long local_58;
  ulong local_50;
  int local_34;
  undefined8 *local_30;
  int local_1c;
  undefined8 local_18;
  uint64_t local_8;
  
  local_30 = in_R8;
  if (in_EDX == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<char[],_std::default_delete<char[]>_> *)0x18e96f);
    if (!bVar1) {
      *(long *)(in_RDI + 0x440) = *(long *)(in_RDI + 0x20) * (long)*(int *)(in_RDI + 0x28);
      operator_new__(*(ulong *)(in_RDI + 0x440));
      std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff30);
    *local_30 = pcVar3;
    local_8 = 0;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    memset(local_78,0,0x40);
    p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18ea02);
    iVar2 = exr_chunk_default_initialize
                      (p_Var4,0,in_RCX,*(undefined4 *)(in_RDI + 0x450),
                       *(undefined4 *)(in_RDI + 0x454),local_78);
    if (iVar2 != 0) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar5,"Unable to initialize chunk information");
      __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if ((*(int *)(in_RDI + 0x30) == 2) || (*(int *)(in_RDI + 0x30) == 3)) {
      if (*(long *)(in_RDI + 0x448) == 0) {
        local_80 = *(ulong *)(in_RDI + 0x20);
        local_50 = *(ulong *)(in_RDI + 0x20);
      }
      else {
        local_80 = *(ulong *)(in_RDI + 0x448);
        local_50 = *(ulong *)(in_RDI + 0x448);
      }
    }
    else {
      local_80 = local_50;
    }
    local_58 = (long)local_1c;
    local_62 = (undefined1)*(undefined4 *)(in_RDI + 0x30);
    if (*(ulong *)(in_RDI + 0x440) < local_80) {
      local_98[0] = *(long *)(in_RDI + 0x20) * (long)*(int *)(in_RDI + 0x28);
      puVar6 = std::max<unsigned_long>(local_98,&local_80);
      *(unsigned_long *)(in_RDI + 0x440) = *puVar6;
      operator_new__(*(ulong *)(in_RDI + 0x440));
      std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    if ((*(byte *)(in_RDI + 0x430) & 1) == 0) {
      p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18eba1);
      iVar2 = exr_decoding_initialize(p_Var4,0,local_78,in_RDI + 0x38);
      if (iVar2 != 0) {
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar5,"Unable to initialize decoder type");
        __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      *(undefined1 *)(in_RDI + 0x430) = 1;
    }
    else {
      p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18ec38);
      iVar2 = exr_decoding_update(p_Var4,0,local_78,in_RDI + 0x38);
      if (iVar2 != 0) {
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar5,"Unable to update decoder");
        __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    *(undefined8 *)(in_RDI + 0xb0) = local_18;
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff30);
    *(pointer *)(in_RDI + 0xc0) = pcVar3;
    *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RDI + 0x440);
    local_34 = exr_uncompress_chunk(in_RDI + 0x38);
    *(undefined8 *)(in_RDI + 0xb0) = 0;
    *(undefined8 *)(in_RDI + 0xc0) = 0;
    *(undefined8 *)(in_RDI + 200) = 0;
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff30);
    *local_30 = pcVar3;
    if (local_34 != 0) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar5,"Unable to run compression routine");
      __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    local_8 = *(uint64_t *)(in_RDI + 0xa0);
  }
  return local_8;
}

Assistant:

uint64_t
Compressor::runDecodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        if (!_memory_buffer)
        {
            _buf_sz = _maxScanLineSize * _numScanLines;
            _memory_buffer.reset (new char[_buf_sz]);
        }
        outPtr = _memory_buffer.get ();
        return 0;
    }

    exr_result_t rv;
    exr_chunk_info_t cinfo = {0};
    uint64_t expectedOutputSize;

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
        _store_type == EXR_STORAGE_DEEP_TILED)
    {
        if (_expectedSize != 0)
        {
            expectedOutputSize = _expectedSize;
            cinfo.unpacked_size = _expectedSize;
        }
        else
        {
            expectedOutputSize = _maxScanLineSize;
            cinfo.unpacked_size = _maxScanLineSize;
        }
    }
    else
    {
        expectedOutputSize = cinfo.unpacked_size;
    }

    cinfo.packed_size = inSize;
    cinfo.type = _store_type;
    if (_buf_sz < expectedOutputSize)
    {
        uint64_t fullbuf = _maxScanLineSize * _numScanLines;
        _buf_sz = std::max (fullbuf, expectedOutputSize);
        _memory_buffer.reset (new char[_buf_sz]);
    }

    if (!_decoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_decoding_initialize(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize decoder type");

        _decoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_decoding_update(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update decoder");
    }

//    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
//        _store_type == EXR_STORAGE_DEEP_TILED)
//    {
//        _decoder.decode_flags |= EXR_DECODE_ALLOW_SHORT_DECODE;
//    }

    _decoder.packed_buffer = const_cast<char*> (inPtr);
    _decoder.unpacked_buffer = _memory_buffer.get();
    _decoder.unpacked_alloc_size = _buf_sz;

    rv = exr_uncompress_chunk(&_decoder);

    _decoder.packed_buffer   = nullptr;
    _decoder.unpacked_buffer = nullptr;
    _decoder.unpacked_alloc_size = 0;

    outPtr = _memory_buffer.get ();

    if (EXR_ERR_SUCCESS != rv)
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    return _decoder.bytes_decompressed;
}